

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

void Au_ManPrintBoxInfoSorted(Au_Ntk_t *pNtk)

{
  uint uVar1;
  void ***pppvVar2;
  int *piVar3;
  int iVar4;
  Au_Man_t *pAVar5;
  undefined8 *puVar6;
  void *__dest;
  long lVar7;
  ulong uVar8;
  
  pAVar5 = pNtk->pMan;
  if (pAVar5 == (Au_Man_t *)0x0) {
    puts("There is no hierarchy information.");
    return;
  }
  iVar4 = (pAVar5->vNtks).nSize;
  uVar1 = iVar4 - 1;
  (pAVar5->vNtks).nSize = uVar1;
  pppvVar2 = &(pAVar5->vNtks).pArray;
  *pppvVar2 = *pppvVar2 + 1;
  lVar7 = (long)(pAVar5->vNtks).nCap;
  if (lVar7 == 0) {
    __dest = (void *)0x0;
  }
  else {
    __dest = malloc(lVar7 << 3);
  }
  memcpy(__dest,(pAVar5->vNtks).pArray,(long)(int)uVar1 << 3);
  pppvVar2 = &(pAVar5->vNtks).pArray;
  *pppvVar2 = *pppvVar2 + -1;
  piVar3 = &(pAVar5->vNtks).nSize;
  *piVar3 = *piVar3 + 1;
  if (2 < iVar4) {
    qsort(__dest,(ulong)uVar1,8,Au_NtkCompareSign);
    uVar8 = 1;
    do {
      puVar6 = *(undefined8 **)((long)__dest + uVar8 * 8);
      printf("MODULE  ");
      printf("%-30s : ",*puVar6);
      printf("PI=%6d ",(ulong)*(uint *)(puVar6 + 10));
      printf("PO=%6d ",(ulong)*(uint *)((long)puVar6 + 0x54));
      printf("BB=%6d ",(ulong)*(uint *)(puVar6 + 0xc));
      printf("ND=%6d ",(ulong)*(uint *)((long)puVar6 + 100));
      putchar(10);
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  if (__dest == (void *)0x0) {
    return;
  }
  free(__dest);
  return;
}

Assistant:

void Au_ManPrintBoxInfoSorted( Au_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods, * vModsNew;
    Au_Ntk_t * pModel;
    int i;
    if ( pNtk->pMan == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        return;
    }
    vMods = &pNtk->pMan->vNtks;

    vMods->nSize--;
    vMods->pArray++;
    vModsNew = Vec_PtrDup( vMods );
    vMods->pArray--;
    vMods->nSize++;

    Vec_PtrSort( vModsNew, (int(*)())Au_NtkCompareSign );
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vModsNew, pModel, i, 1 )
    {
        printf( "MODULE  " );
        printf( "%-30s : ", Au_NtkName(pModel) );
        printf( "PI=%6d ", Au_NtkPiNum(pModel) );
        printf( "PO=%6d ", Au_NtkPoNum(pModel) );
        printf( "BB=%6d ", Au_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Au_NtkNodeNum(pModel) );
        printf( "\n" );
    }
    Vec_PtrFree( vModsNew );
}